

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::unpack_expression_type
          (string *__return_storage_ptr__,CompilerMSL *this,string *expr_str,SPIRType *type,
          uint32_t physical_type_id,bool packed,bool row_major)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  SPIRType *type_00;
  bool bVar5;
  int iVar6;
  SPIRType *type_01;
  long *plVar7;
  long lVar8;
  size_type *psVar9;
  undefined7 in_register_00000089;
  char (*pacVar10) [2];
  char (*pacVar11) [2];
  bool bVar12;
  char (*in_stack_ffffffffffffff58) [2];
  uint32_t columns;
  uint local_9c;
  allocator local_95;
  undefined4 local_94;
  uint32_t physical_vecsize;
  uint32_t vecsize;
  string local_88;
  char *load_swiz;
  SPIRType *local_60;
  char *base_type;
  undefined1 *local_50;
  string *local_48;
  undefined1 local_40 [16];
  
  pacVar10 = (char (*) [2])CONCAT71(in_register_00000089,packed);
  if (physical_type_id == 0 && !packed) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (expr_str->_M_dataplus)._M_p;
    paVar1 = &expr_str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar1) {
      uVar3 = *(undefined8 *)((long)&expr_str->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = expr_str->_M_string_length;
    (expr_str->_M_dataplus)._M_p = (pointer)paVar1;
    expr_str->_M_string_length = 0;
    (expr_str->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  pacVar11 = pacVar10;
  if (physical_type_id == 0) {
    type_01 = (SPIRType *)0x0;
  }
  else {
    type_01 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + physical_type_id);
  }
  local_94 = SUB84(pacVar10,0);
  local_60 = type;
  if ((((type_01 == (SPIRType *)0x0) ||
       (bVar5 = Compiler::is_vector((Compiler *)this,type_01), !bVar5)) ||
      (bVar5 = Compiler::is_array((Compiler *)this,type_01), !bVar5)) ||
     (type_01->vecsize <= type->vecsize)) {
    bVar5 = false;
    bVar12 = false;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_50,unpack_expression_type::swizzle_lut[type->vecsize - 1],&local_95)
    ;
    bVar5 = true;
    if ((string *)expr_str->_M_string_length < local_48) {
      bVar12 = true;
    }
    else {
      iVar6 = ::std::__cxx11::string::compare
                        ((ulong)expr_str,(long)expr_str->_M_string_length - (long)local_48,local_48)
      ;
      bVar12 = iVar6 != 0;
    }
  }
  type_00 = local_60;
  if ((bVar5) && (local_50 != local_40)) {
    operator_delete(local_50);
  }
  if (bVar12) {
    if (2 < type_00->vecsize - 1) {
      __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0xefa,
                    "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                   );
    }
    CompilerGLSL::enclose_expression(&local_88,&this->super_CompilerGLSL,expr_str);
    plVar7 = (long *)::std::__cxx11::string::append((char *)&local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      lVar8 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar8;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  else if (((type_01 == (SPIRType *)0x0) ||
           (bVar5 = Compiler::is_matrix((Compiler *)this,type_01), !bVar5)) ||
          ((bVar5 = Compiler::is_vector((Compiler *)this,type_00), !bVar5 ||
           (type_01->vecsize <= type_00->vecsize)))) {
    bVar5 = Compiler::is_matrix((Compiler *)this,type_00);
    uVar4 = local_94;
    if (bVar5) {
      if (type_01 == (SPIRType *)0x0) {
        type_01 = type_00;
      }
      vecsize = type_00->vecsize;
      if (row_major) {
        lVar8 = 0x18;
        columns = vecsize;
        vecsize = type_00->columns;
      }
      else {
        lVar8 = 0x14;
        columns = type_00->columns;
      }
      physical_vecsize = *(uint32_t *)((type_01->array).stack_storage.aligned_char + lVar8 + -0x38);
      base_type = "float";
      if (type_00->width == 0x10) {
        base_type = "half";
      }
      join<char_const*&,unsigned_int&,char_const(&)[2],unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&base_type,(char **)&columns,(uint *)0x2e2f05
                 ,(char (*) [2])&vecsize,(uint *)0x2f8011,in_stack_ffffffffffffff58);
      load_swiz = "";
      if (physical_vecsize != vecsize) {
        load_swiz = unpack_expression_type::swizzle_lut[vecsize - 1];
      }
      local_9c = 0;
      if (columns != 0) {
        do {
          if (local_9c != 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if ((char)uVar4 == '\0') {
            join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const*&>
                      (&local_88,(spirv_cross *)expr_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f570e
                       ,(char (*) [2])&local_9c,(uint *)0x2e790f,(char (*) [2])&load_swiz,
                       (char **)in_stack_ffffffffffffff58);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_002619b3;
          }
          else {
            join<char_const*&,unsigned_int&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[2],char_const*&>
                      (&local_88,(spirv_cross *)&base_type,(char **)&physical_vecsize,
                       (uint *)0x2f8011,(char (*) [2])expr_str,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f570e
                       ,(char (*) [2])&local_9c,(uint *)0x2e790f,(char (*) [2])0x2e3e76,
                       (char (*) [2])&load_swiz,(char **)in_stack_ffffffffffffff58);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
LAB_002619b3:
              operator_delete(local_88._M_dataplus._M_p);
            }
          }
          local_9c = local_9c + 1;
        } while (local_9c < columns);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_88,this,type_00,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f8011,
               (char (*) [2])expr_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e3e76,
               pacVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    if (2 < type_00->vecsize - 1) {
      __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0xf00,
                    "virtual string spirv_cross::CompilerMSL::unpack_expression_type(string, const SPIRType &, uint32_t, bool, bool)"
                   );
    }
    CompilerGLSL::enclose_expression(&local_88,&this->super_CompilerGLSL,expr_str);
    ::std::operator+(__return_storage_ptr__,&local_88,
                     unpack_expression_type::swizzle_lut[type_00->vecsize - 1]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_88._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::unpack_expression_type(string expr_str, const SPIRType &type, uint32_t physical_type_id,
                                           bool packed, bool row_major)
{
	// Trivial case, nothing to do.
	if (physical_type_id == 0 && !packed)
		return expr_str;

	const SPIRType *physical_type = nullptr;
	if (physical_type_id)
		physical_type = &get<SPIRType>(physical_type_id);

	static const char *swizzle_lut[] = {
		".x",
		".xy",
		".xyz",
	};

	if (physical_type && is_vector(*physical_type) && is_array(*physical_type) &&
	    physical_type->vecsize > type.vecsize && !expression_ends_with(expr_str, swizzle_lut[type.vecsize - 1]))
	{
		// std140 array cases for vectors.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (physical_type && is_matrix(*physical_type) && is_vector(type) && physical_type->vecsize > type.vecsize)
	{
		// Extract column from padded matrix.
		assert(type.vecsize >= 1 && type.vecsize <= 3);
		return enclose_expression(expr_str) + swizzle_lut[type.vecsize - 1];
	}
	else if (is_matrix(type))
	{
		// Packed matrices are stored as arrays of packed vectors. Unfortunately,
		// we can't just pass the array straight to the matrix constructor. We have to
		// pass each vector individually, so that they can be unpacked to normal vectors.
		if (!physical_type)
			physical_type = &type;

		uint32_t vecsize = type.vecsize;
		uint32_t columns = type.columns;
		if (row_major)
			swap(vecsize, columns);

		uint32_t physical_vecsize = row_major ? physical_type->columns : physical_type->vecsize;

		const char *base_type = type.width == 16 ? "half" : "float";
		string unpack_expr = join(base_type, columns, "x", vecsize, "(");

		const char *load_swiz = "";

		if (physical_vecsize != vecsize)
			load_swiz = swizzle_lut[vecsize - 1];

		for (uint32_t i = 0; i < columns; i++)
		{
			if (i > 0)
				unpack_expr += ", ";

			if (packed)
				unpack_expr += join(base_type, physical_vecsize, "(", expr_str, "[", i, "]", ")", load_swiz);
			else
				unpack_expr += join(expr_str, "[", i, "]", load_swiz);
		}

		unpack_expr += ")";
		return unpack_expr;
	}
	else
	{
		return join(type_to_glsl(type), "(", expr_str, ")");
	}
}